

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char8_t * fmt::v5::internal::
          parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                    (char8_t *begin,char8_t *end,
                    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
                    *handler)

{
  char8_t cVar1;
  uint id;
  char8_t *pcVar2;
  char8_t *pcVar3;
  char8_t *pcVar4;
  basic_string_view<fmt::v5::char8_t> id_00;
  char8_t *local_20;
  
  cVar1 = *begin;
  pcVar4 = begin;
  local_20 = begin;
  if ((cVar1 == 0x7d) || (cVar1 == 0x3a)) {
    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
    ::operator()(handler);
  }
  else if ((byte)(cVar1 - 0x30) < 10) {
    id = parse_nonnegative_int<fmt::v5::char8_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>&>
                   (&local_20,end,handler);
    if ((local_20 == end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
      precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
      ::on_error(handler,"invalid format string");
      pcVar4 = local_20;
    }
    else {
      precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
      ::operator()(handler,id);
      pcVar4 = local_20;
    }
  }
  else if ((cVar1 == 0x5f) || ((byte)((cVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pcVar3 = begin + 1;
    do {
      pcVar2 = pcVar3;
      pcVar4 = end;
      if (pcVar2 == end) break;
      cVar1 = *pcVar2;
      pcVar3 = pcVar2 + 1;
    } while ((((byte)(cVar1 - 0x30) < 10) || (cVar1 == 0x5f)) ||
            (pcVar4 = pcVar2, (byte)((cVar1 & 0xdf) + 0xbf) < 0x1a));
    id_00.size_ = (long)pcVar4 - (long)begin;
    id_00.data_ = begin;
    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
    ::operator()(handler,id_00);
  }
  else {
    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
    ::on_error(handler,"invalid format string");
  }
  return pcVar4;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}